

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLFWbool GVar1;
  char *pcVar2;
  _GLFWwindow *window;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  GLFWwindow *share_local;
  GLFWmonitor *monitor_local;
  char *title_local;
  int height_local;
  int width_local;
  
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0xbe,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (width < 0) {
    __assert_fail("width >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0xbf,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (height < 0) {
    __assert_fail("height >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0xc0,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    _height_local = (_GLFWwindow *)0x0;
  }
  else if ((width < 1) || (height < 1)) {
    _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,(ulong)(uint)height);
    _height_local = (_GLFWwindow *)0x0;
  }
  else {
    memcpy(&ctxconfig.nsgl,&_glfw.hints.framebuffer,0x48);
    memcpy(wndconfig.wl.appId + 0xf8,&_glfw.hints.context,0x38);
    memcpy(&window,&_glfw.hints.window,0x450);
    wndconfig.xpos = width;
    wndconfig.ypos = height;
    wndconfig._8_8_ = title;
    ctxconfig._32_8_ = share;
    GVar1 = _glfwIsValidContextConfig((_GLFWctxconfig *)(wndconfig.wl.appId + 0xf8));
    if (GVar1 == 0) {
      _height_local = (_GLFWwindow *)0x0;
    }
    else {
      _height_local = (_GLFWwindow *)_glfw_calloc(1,0xd58);
      _height_local->next = _glfw.windowListHead;
      _glfw.windowListHead = _height_local;
      (_height_local->videoMode).width = width;
      (_height_local->videoMode).height = height;
      (_height_local->videoMode).redBits = ctxconfig.nsgl.offline;
      (_height_local->videoMode).greenBits = ctxconfig._52_4_;
      (_height_local->videoMode).blueBits = fbconfig.redBits;
      (_height_local->videoMode).refreshRate = _glfw.hints.refreshRate;
      _height_local->monitor = (_GLFWmonitor *)monitor;
      _height_local->resizable = (GLFWbool)wndconfig.title;
      _height_local->decorated = wndconfig.resizable;
      _height_local->autoIconify = wndconfig.decorated;
      _height_local->floating = wndconfig.focused;
      _height_local->focusOnShow = wndconfig.maximized;
      _height_local->mousePassthrough = wndconfig.centerCursor;
      _height_local->cursorMode = 0x34001;
      _height_local->doublebuffer = fbconfig.samples;
      _height_local->minwidth = -1;
      _height_local->minheight = -1;
      _height_local->maxwidth = -1;
      _height_local->maxheight = -1;
      _height_local->numer = -1;
      _height_local->denom = -1;
      pcVar2 = _glfw_strdup(title);
      _height_local->title = pcVar2;
      GVar1 = (*_glfw.platform.createWindow)
                        (_height_local,(_GLFWwndconfig *)&window,
                         (_GLFWctxconfig *)(wndconfig.wl.appId + 0xf8),
                         (_GLFWfbconfig *)&ctxconfig.nsgl);
      if (GVar1 == 0) {
        glfwDestroyWindow((GLFWwindow *)_height_local);
        _height_local = (_GLFWwindow *)0x0;
      }
    }
  }
  return (GLFWwindow *)_height_local;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;

    assert(title != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = _glfw_calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor          = (_GLFWmonitor*) monitor;
    window->resizable        = wndconfig.resizable;
    window->decorated        = wndconfig.decorated;
    window->autoIconify      = wndconfig.autoIconify;
    window->floating         = wndconfig.floating;
    window->focusOnShow      = wndconfig.focusOnShow;
    window->mousePassthrough = wndconfig.mousePassthrough;
    window->cursorMode       = GLFW_CURSOR_NORMAL;

    window->doublebuffer = fbconfig.doublebuffer;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;
    window->title       = _glfw_strdup(title);

    if (!_glfw.platform.createWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    return (GLFWwindow*) window;
}